

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AntennaLocation.h
# Opt level: O0

AntennaLocation * __thiscall
KDIS::DATA_TYPE::AntennaLocation::operator=(AntennaLocation *this,AntennaLocation *param_1)

{
  AntennaLocation *param_1_local;
  AntennaLocation *this_local;
  
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  WorldCoordinates::operator=(&this->m_AntennaLocation,&param_1->m_AntennaLocation);
  Vector::operator=(&this->m_RelativeAntennaLocation,&param_1->m_RelativeAntennaLocation);
  return this;
}

Assistant:

class KDIS_EXPORT AntennaLocation : public DataTypeBase
{
protected:

    WorldCoordinates m_AntennaLocation;

    Vector m_RelativeAntennaLocation;

public:

    static const KUINT16 ANTENNA_LOCATION_SIZE = 36;

    AntennaLocation();

    explicit AntennaLocation(KDataStream &stream) noexcept(false);

    AntennaLocation( const WorldCoordinates & Location, const Vector & RelativeLocation );

    ~AntennaLocation() override;

    //************************************
    // FullName:    KDIS::DataTypes::AntennaLocation::SetAntennaLocation
    //              KDIS::DataTypes::AntennaLocation::GetAntennaLocation
    // Description: Antenna world location
    // Parameter:   const WorldCoordinates & AL
    //************************************
    void SetAntennaLocation( const WorldCoordinates & AL );
    const WorldCoordinates & GetAntennaLocation() const;
    WorldCoordinates & GetAntennaLocation();

    //************************************
    // FullName:    KDIS::DataTypes::SetRelativeAntennaLocation
    //              KDIS::DataTypes::GetRelativeAntennaLocation
    // Description: Antenna entity location. Represented as Entity Coordinate Vector
    // Parameter:   const Vector & RAL
    //************************************
    void SetRelativeAntennaLocation( const Vector & RAL );
    const Vector & GetRelativeAntennaLocation() const;
    Vector & GetRelativeAntennaLocation();

    //************************************
    // FullName:    KDIS::DataTypes::AntennaLocation::GetAsString
    // Description: Returns a string representation
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DataTypes::AntennaLocation::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DataTypes::AntennaLocation::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;

    void Encode(KDataStream &stream) const override;

    KBOOL operator == ( const AntennaLocation & Value ) const;
    KBOOL operator != ( const AntennaLocation & Value ) const;
}